

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::decodeDouble(OurReader *this,Token *token,Value *decoded)

{
  undefined8 uVar1;
  long in_RSI;
  string buffer_1;
  Char buffer [33];
  char format [4];
  int length;
  int count;
  int bufferSize;
  double value;
  Value *other;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  allocator<char> *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_fffffffffffffe70;
  char *__end;
  char *in_stack_fffffffffffffe78;
  allocator<char> *__beg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  Value *in_stack_fffffffffffffe90;
  Location in_stack_fffffffffffffeb8;
  Token *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  OurReader *in_stack_fffffffffffffed0;
  allocator<char> local_121;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [39];
  undefined1 local_b9 [33];
  undefined1 local_98 [40];
  undefined4 local_70 [5];
  allocator local_59;
  string local_58 [36];
  int local_34;
  int local_30;
  undefined4 local_2c;
  undefined8 local_28 [2];
  long local_18;
  byte local_1;
  
  local_28[0] = 0;
  local_2c = 0x20;
  local_34 = (int)*(undefined8 *)(in_RSI + 0x10) - (int)*(undefined8 *)(in_RSI + 8);
  if (local_34 < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Unable to parse token length",&local_59);
    local_1 = addError(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0
                       ,in_stack_fffffffffffffeb8);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  else {
    local_70[0] = 0x666c25;
    local_18 = in_RSI;
    if (local_34 < 0x21) {
      memcpy(local_98,*(void **)(in_RSI + 8),(long)local_34);
      local_98[local_34] = 0;
      local_30 = __isoc99_sscanf(local_98,local_70,local_28);
    }
    else {
      in_stack_fffffffffffffe80 =
           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RSI + 8);
      in_stack_fffffffffffffe90 = (Value *)local_b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                 in_stack_fffffffffffffe68);
      std::allocator<char>::~allocator((allocator<char> *)local_b9);
      uVar1 = std::__cxx11::string::c_str();
      local_30 = __isoc99_sscanf(uVar1,local_70,local_28);
      std::__cxx11::string::~string((string *)(local_b9 + 1));
    }
    if (local_30 == 1) {
      other = (Value *)&stack0xfffffffffffffeb0;
      Value::Value((Value *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                   (double)other);
      Value::operator=((Value *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),other)
      ;
      Value::~Value(in_stack_fffffffffffffe90);
      local_1 = 1;
    }
    else {
      __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_18 + 8);
      __end = *(char **)(local_18 + 0x10);
      __beg = &local_121;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>
                (in_stack_fffffffffffffe80,(char *)__beg,__end,(allocator<char> *)__lhs);
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      std::operator+(__lhs,(char *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
      local_1 = addError(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                         in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_120);
      std::allocator<char>::~allocator(&local_121);
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OurReader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  const int bufferSize = 32;
  int count;
  int length = int(token.end_ - token.start_);

  // Sanity check to avoid buffer overflow exploits.
  if (length < 0) {
    return addError("Unable to parse token length", token);
  }

  // Avoid using a string constant for the format control string given to
  // sscanf, as this can cause hard to debug crashes on OS X. See here for more
  // info:
  //
  //     http://developer.apple.com/library/mac/#DOCUMENTATION/DeveloperTools/gcc-4.0.1/gcc/Incompatibilities.html
  char format[] = "%lf";

  if (length <= bufferSize) {
    Char buffer[bufferSize + 1];
    memcpy(buffer, token.start_, length);
    buffer[length] = 0;
    count = sscanf(buffer, format, &value);
  } else {
    std::string buffer(token.start_, token.end_);
    count = sscanf(buffer.c_str(), format, &value);
  }

  if (count != 1)
    return addError("'" + std::string(token.start_, token.end_) +
                        "' is not a number.",
                    token);
  decoded = value;
  return true;
}